

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O0

void __thiscall LoaderLogger::RemoveLogRecorder(LoaderLogger *this,uint64_t unique_id)

{
  bool bVar1;
  reference ppVar2;
  size_type sVar3;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *messengersForInstance;
  pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *recorders;
  iterator __end1;
  iterator __begin1;
  unordered_map<XrInstance_T_*,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  *__range1;
  anon_class_8_1_f5828ee9_for__M_pred local_30;
  undefined1 local_28 [8];
  unique_lock<std::shared_timed_mutex> lock;
  uint64_t unique_id_local;
  LoaderLogger *this_local;
  
  lock._8_8_ = unique_id;
  std::unique_lock<std::shared_timed_mutex>::unique_lock
            ((unique_lock<std::shared_timed_mutex> *)local_28,&this->_mutex);
  local_30.unique_id = lock._8_8_;
  vector_remove_if_and_erase<std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>,std::allocator<std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>>,LoaderLogger::RemoveLogRecorder(unsigned_long)::__0>
            (&this->_recorders,&local_30);
  __end1 = std::
           unordered_map<XrInstance_T_*,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
           ::begin(&this->_recordersByInstance);
  recorders = (pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
               *)std::
                 unordered_map<XrInstance_T_*,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                 ::end(&this->_recordersByInstance);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                         *)&recorders);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false,_false>
             ::operator*(&__end1);
    sVar3 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::count(&ppVar2->second,(key_type *)&lock._M_owns);
    if (sVar3 != 0) {
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::erase(&ppVar2->second,(key_type *)&lock._M_owns);
    }
    std::__detail::
    _Node_iterator<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false,_false>
    ::operator++(&__end1);
  }
  std::unique_lock<std::shared_timed_mutex>::~unique_lock
            ((unique_lock<std::shared_timed_mutex> *)local_28);
  return;
}

Assistant:

void LoaderLogger::RemoveLogRecorder(uint64_t unique_id) {
    std::unique_lock<std::shared_timed_mutex> lock(_mutex);
    vector_remove_if_and_erase(
        _recorders, [=](std::unique_ptr<LoaderLogRecorder> const& recorder) { return recorder->UniqueId() == unique_id; });
    for (auto& recorders : _recordersByInstance) {
        auto& messengersForInstance = recorders.second;
        if (messengersForInstance.count(unique_id) > 0) {
            messengersForInstance.erase(unique_id);
        }
    }
}